

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectAnimationSet(XFileParser *this)

{
  bool bVar1;
  Logger *this_00;
  allocator<char> local_91;
  Animation *anim;
  string animName;
  string objectName;
  string local_48;
  
  animName._M_dataplus._M_p = (pointer)&animName.field_2;
  animName._M_string_length = 0;
  animName.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&animName);
  anim = (Animation *)operator_new(0x38);
  (anim->mName)._M_dataplus._M_p = (pointer)&(anim->mName).field_2;
  (anim->mName)._M_string_length = 0;
  (anim->mName).field_2._M_local_buf[0] = '\0';
  (anim->mAnims).
  super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (anim->mAnims).
  super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (anim->mAnims).
  super__Vector_base<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::push_back
            (&this->mScene->mAnims,&anim);
  std::__cxx11::string::_M_assign((string *)anim);
  while( true ) {
    GetNextToken_abi_cxx11_(&objectName,this);
    if (objectName._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Unexpected end of file while parsing animation set.",&local_91
                );
      ThrowException(this,&local_48);
    }
    bVar1 = std::operator==(&objectName,"}");
    if (bVar1) break;
    bVar1 = std::operator==(&objectName,"Animation");
    if (bVar1) {
      ParseDataObjectAnimation(this,anim);
    }
    else {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Unknown data object in animation set in x file");
      ParseUnknownDataObject(this);
    }
    std::__cxx11::string::~string((string *)&objectName);
  }
  std::__cxx11::string::~string((string *)&objectName);
  std::__cxx11::string::~string((string *)&animName);
  return;
}

Assistant:

void XFileParser::ParseDataObjectAnimationSet()
{
    std::string animName;
    readHeadOfDataObject( &animName);

    Animation* anim = new Animation;
    mScene->mAnims.push_back( anim);
    anim->mName = animName;

    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.length() == 0)
            ThrowException( "Unexpected end of file while parsing animation set.");
        else
        if( objectName == "}")
            break; // animation set finished
        else
        if( objectName == "Animation")
            ParseDataObjectAnimation( anim);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in animation set in x file");
            ParseUnknownDataObject();
        }
    }
}